

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O2

void __thiscall Triangle_BadCases_Test::TestBody(Triangle_BadCases_Test *this)

{
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  Allocator alloc;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  _Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *s;
  initializer_list<int> __l;
  initializer_list<pbrt::Point3<float>_> __l_00;
  pointer pPVar1;
  undefined1 in_stack_fffffffffffffcd8 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  AssertionResult gtest_ar_;
  _Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_300;
  _Vector_base<int,_std::allocator<int>_> local_2e8;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> p;
  vector<int,_std::allocator<int>_> indices;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> tris;
  Ray local_280;
  _Vector_base<int,_std::allocator<int>_> local_258;
  _Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> local_238;
  _Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> local_218;
  _Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_1f8;
  TriangleMesh mesh;
  AssertionResult gtest_ar;
  bool local_98;
  Transform identity;
  
  pbrt::Transform::Transform(&identity);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0x1000000;
  gtest_ar.message_.ptr_._0_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)&gtest_ar;
  std::vector<int,_std::allocator<int>_>::vector(&indices,__l,(allocator_type *)&mesh);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0xc29e1967c48b2e;
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc48b2e8cc260f907;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&gtest_ar;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            (&p,__l_00,(allocator_type *)&mesh);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_2e8,&indices);
  pPVar1 = (pointer)0x2f61e0;
  std::vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::vector
            ((vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_300,&p);
  s = &local_1f8;
  local_1f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&local_238;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_218;
  n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&local_258;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffcd8._0_8_;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffcd8._8_8_;
  uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = pPVar1;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = gtest_ar_.success_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._1_3_ = gtest_ar_._1_3_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)local_318.ptr_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = gtest_ar_._4_4_;
  faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)gtest_ar_.message_.ptr_;
  pbrt::TriangleMesh::TriangleMesh
            (&mesh,&identity,false,(vector<int,_std::allocator<int>_> *)&local_2e8,
             (vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> *)&local_300,
             (vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> *)s,n,uv,
             faceIndices);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_258);
  std::_Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>::~_Vector_base
            (&local_238);
  std::_Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>::~_Vector_base
            (&local_218);
  std::_Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>::~_Vector_base
            (&local_1f8);
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&local_300);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_2e8);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  pbrt::Triangle::CreateTriangles(&tris,&mesh,alloc);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  local_280.o.super_Tuple3<pbrt::Point3,_float>.x = (float)(undefined4)tris.nStored;
  local_280.o.super_Tuple3<pbrt::Point3,_float>.y = (float)tris.nStored._4_4_;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"1","tris.size()",(int *)&gtest_ar_,(unsigned_long *)&local_280);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_280);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
               ,0x1ba,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&local_280);
    this_00 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_280);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_280.o.super_Tuple3<pbrt::Point3,_float>.x = -1081.4792;
    local_280.o.super_Tuple3<pbrt::Point3,_float>.y = 99.999954;
    local_280.o.super_Tuple3<pbrt::Point3,_float>.z = 87.77011;
    local_280.d.super_Tuple3<pbrt::Vector3,_float>.x = -32.1073;
    local_280.d.super_Tuple3<pbrt::Vector3,_float>.y = -183.35587;
    local_280.d.super_Tuple3<pbrt::Vector3,_float>.z = -144.60764;
    local_280.time = 0.9999;
    local_280.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    pbrt::ShapeHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&gtest_ar,tris.ptr,&local_280,INFINITY);
    this_00 = &gtest_ar_.message_;
    gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,local_98) ^ 1;
    gtest_ar_.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)&gtest_ar);
    if (local_98 != false) {
      testing::Message::Message((Message *)&local_318);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,
                 (AssertionResult *)"tris[0].Intersect(ray).has_value()","true","false",(char *)s);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffce0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                 ,0x1bf,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffce0,(Message *)&local_318);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffce0);
      std::__cxx11::string::~string((string *)&gtest_ar);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_318);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(this_00);
  pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
            (&tris);
  std::_Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>::~_Vector_base
            (&p.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&indices.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

TEST(Triangle, BadCases) {
    Transform identity;
    std::vector<int> indices{0, 1, 2};
    std::vector<Point3f> p{Point3f(-1113.45459, -79.049614, -56.2431908),
                           Point3f(-1113.45459, -87.0922699, -56.2431908),
                           Point3f(-1113.45459, -79.2090149, -56.2431908)};
    TriangleMesh mesh(identity, false, indices, p, {}, {}, {}, {});
    auto tris = Triangle::CreateTriangles(&mesh, Allocator());
    ASSERT_EQ(1, tris.size());

    Ray ray(Point3f(-1081.47925, 99.9999542, 87.7701111),
            Vector3f(-32.1072998, -183.355865, -144.607635), 0.9999);

    EXPECT_FALSE(tris[0].Intersect(ray).has_value());
}